

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O2

void ImGui::ShadeVertsLinearAlphaGradientForLeftToRightText
               (ImDrawVert *vert_start,ImDrawVert *vert_end,float gradient_p0_x,float gradient_p1_x)

{
  int iVar1;
  ImDrawVert *pIVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  
  fVar3 = gradient_p1_x - gradient_p0_x;
  pIVar2 = vert_end + -1;
  iVar1 = 0;
  do {
    if (pIVar2 < vert_start) {
      return;
    }
    fVar4 = ((pIVar2->pos).x - gradient_p0_x) * fVar3 * (1.0 / (fVar3 * fVar3));
    fVar5 = 1.0;
    if (fVar4 <= 1.0) {
      fVar5 = fVar4;
    }
    fVar5 = (float)(-(uint)(fVar4 < 0.0) & 0x3f800000 | ~-(uint)(fVar4 < 0.0) & (uint)(1.0 - fVar5))
    ;
    if (1.0 <= fVar5) {
      if (1 < iVar1) {
        return;
      }
      iVar1 = iVar1 + 1;
    }
    *(char *)((long)&pIVar2->col + 3) =
         (char)(int)((float)*(byte *)((long)&pIVar2->col + 3) * fVar5);
    pIVar2 = pIVar2 + -1;
  } while( true );
}

Assistant:

void ImGui::ShadeVertsLinearAlphaGradientForLeftToRightText(ImDrawVert* vert_start, ImDrawVert* vert_end, float gradient_p0_x, float gradient_p1_x)
{
    float gradient_extent_x = gradient_p1_x - gradient_p0_x;
    float gradient_inv_length2 = 1.0f / (gradient_extent_x * gradient_extent_x);
    int full_alpha_count = 0;
    for (ImDrawVert* vert = vert_end - 1; vert >= vert_start; vert--)
    {
        float d = (vert->pos.x - gradient_p0_x) * (gradient_extent_x);
        float alpha_mul = 1.0f - ImClamp(d * gradient_inv_length2, 0.0f, 1.0f);
        if (alpha_mul >= 1.0f && ++full_alpha_count > 2)
            return; // Early out
        int a = (int)(((vert->col >> IM_COL32_A_SHIFT) & 0xFF) * alpha_mul);
        vert->col = (vert->col & ~IM_COL32_A_MASK) | (a << IM_COL32_A_SHIFT);
    }
}